

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O0

bool tinyusdz::IsSupportedGeomPrimvarType(uint32_t tyid)

{
  undefined1 local_9;
  uint32_t tyid_local;
  
  if (tyid == 7) {
    local_9 = true;
  }
  else if (tyid == 9) {
    local_9 = true;
  }
  else if (tyid == 0xe) {
    local_9 = true;
  }
  else if (tyid == 0xf) {
    local_9 = true;
  }
  else if (tyid == 0x11) {
    local_9 = true;
  }
  else if (tyid == 0x12) {
    local_9 = true;
  }
  else if (tyid == 0x13) {
    local_9 = true;
  }
  else if (tyid == 0x14) {
    local_9 = true;
  }
  else if (tyid == 0x15) {
    local_9 = true;
  }
  else if (tyid == 0x16) {
    local_9 = true;
  }
  else if (tyid == 0x1b) {
    local_9 = true;
  }
  else if (tyid == 0x25) {
    local_9 = true;
  }
  else if (tyid == 0x26) {
    local_9 = true;
  }
  else if (tyid == 0x27) {
    local_9 = true;
  }
  else if (tyid == 0x28) {
    local_9 = true;
  }
  else if (tyid == 0x29) {
    local_9 = true;
  }
  else if (tyid == 0x2a) {
    local_9 = true;
  }
  else if (tyid == 0x2b) {
    local_9 = true;
  }
  else if (tyid == 0x2c) {
    local_9 = true;
  }
  else if (tyid == 0x2d) {
    local_9 = true;
  }
  else if (tyid == 0x2e) {
    local_9 = true;
  }
  else if (tyid == 0x2f) {
    local_9 = true;
  }
  else if (tyid == 0x30) {
    local_9 = true;
  }
  else if (tyid == 0x31) {
    local_9 = true;
  }
  else if (tyid == 0x32) {
    local_9 = true;
  }
  else if (tyid == 0x36) {
    local_9 = true;
  }
  else if (tyid == 0x37) {
    local_9 = true;
  }
  else if (tyid == 0x38) {
    local_9 = true;
  }
  else if (tyid == 0x3a) {
    local_9 = true;
  }
  else if (tyid == 0x3b) {
    local_9 = true;
  }
  else if (tyid == 0x3d) {
    local_9 = true;
  }
  else if (tyid == 0x3e) {
    local_9 = true;
  }
  else if (tyid == 0x3f) {
    local_9 = true;
  }
  else if (tyid == 0x40) {
    local_9 = true;
  }
  else if (tyid == 0x41) {
    local_9 = true;
  }
  else if (tyid == 0x42) {
    local_9 = true;
  }
  else if (tyid == 0x43) {
    local_9 = true;
  }
  else if (tyid == 0x44) {
    local_9 = true;
  }
  else if (tyid == 0x45) {
    local_9 = true;
  }
  else if (tyid == 0x46) {
    local_9 = true;
  }
  else if (tyid == 0x47) {
    local_9 = true;
  }
  else if (tyid == 0x49) {
    local_9 = true;
  }
  else if (tyid == 0x4a) {
    local_9 = true;
  }
  else if (tyid == 0x4b) {
    local_9 = true;
  }
  else if (tyid == 0x4c) {
    local_9 = true;
  }
  else if (tyid == 0x4d) {
    local_9 = true;
  }
  else if (tyid == 0x4e) {
    local_9 = true;
  }
  else if (tyid == 0x100007) {
    local_9 = true;
  }
  else if (tyid == 0x100009) {
    local_9 = true;
  }
  else if (tyid == 0x10000e) {
    local_9 = true;
  }
  else if (tyid == 0x10000f) {
    local_9 = true;
  }
  else if (tyid == 0x100011) {
    local_9 = true;
  }
  else if (tyid == 0x100012) {
    local_9 = true;
  }
  else if (tyid == 0x100013) {
    local_9 = true;
  }
  else if (tyid == 0x100014) {
    local_9 = true;
  }
  else if (tyid == 0x100015) {
    local_9 = true;
  }
  else if (tyid == 0x100016) {
    local_9 = true;
  }
  else if (tyid == 0x10001b) {
    local_9 = true;
  }
  else if (tyid == 0x100025) {
    local_9 = true;
  }
  else if (tyid == 0x100026) {
    local_9 = true;
  }
  else if (tyid == 0x100027) {
    local_9 = true;
  }
  else if (tyid == 0x100028) {
    local_9 = true;
  }
  else if (tyid == 0x100029) {
    local_9 = true;
  }
  else if (tyid == 0x10002a) {
    local_9 = true;
  }
  else if (tyid == 0x10002b) {
    local_9 = true;
  }
  else if (tyid == 0x10002c) {
    local_9 = true;
  }
  else if (tyid == 0x10002d) {
    local_9 = true;
  }
  else if (tyid == 0x10002e) {
    local_9 = true;
  }
  else if (tyid == 0x10002f) {
    local_9 = true;
  }
  else if (tyid == 0x100030) {
    local_9 = true;
  }
  else if (tyid == 0x100031) {
    local_9 = true;
  }
  else if (tyid == 0x100032) {
    local_9 = true;
  }
  else if (tyid == 0x100036) {
    local_9 = true;
  }
  else if (tyid == 0x100037) {
    local_9 = true;
  }
  else if (tyid == 0x100038) {
    local_9 = true;
  }
  else if (tyid == 0x10003a) {
    local_9 = true;
  }
  else if (tyid == 0x10003b) {
    local_9 = true;
  }
  else if (tyid == 0x10003d) {
    local_9 = true;
  }
  else if (tyid == 0x10003e) {
    local_9 = true;
  }
  else if (tyid == 0x10003f) {
    local_9 = true;
  }
  else if (tyid == 0x100040) {
    local_9 = true;
  }
  else if (tyid == 0x100041) {
    local_9 = true;
  }
  else if (tyid == 0x100042) {
    local_9 = true;
  }
  else if (tyid == 0x100043) {
    local_9 = true;
  }
  else if (tyid == 0x100044) {
    local_9 = true;
  }
  else if (tyid == 0x100045) {
    local_9 = true;
  }
  else if (tyid == 0x100046) {
    local_9 = true;
  }
  else if (tyid == 0x100047) {
    local_9 = true;
  }
  else if (tyid == 0x100049) {
    local_9 = true;
  }
  else if (tyid == 0x10004a) {
    local_9 = true;
  }
  else if (tyid == 0x10004b) {
    local_9 = true;
  }
  else if (tyid == 0x10004c) {
    local_9 = true;
  }
  else if (tyid == 0x10004d) {
    local_9 = true;
  }
  else if (tyid == 0x10004e) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool IsSupportedGeomPrimvarType(uint32_t tyid) {
  //
  // scalar and 1D
  //
#define SUPPORTED_TYPE_FUN(__ty)                                           \
  case value::TypeTraits<__ty>::type_id(): {                                 \
    return true;                                                           \
  }                                                                        \
  case (value::TypeTraits<__ty>::type_id() | value::TYPE_ID_1D_ARRAY_BIT): { \
    return true;                                                           \
  }

  switch (tyid) {
    APPLY_GEOMPRIVAR_TYPE(SUPPORTED_TYPE_FUN)
    default:
      return false;
  }

#undef SUPPORTED_TYPE_FUN
}